

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (void *param_1,undefined8 *param_2,long *param_3)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  uint matches;
  int diff;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  uint7 in_stack_ffffffffffffffb0;
  bool bVar6;
  matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__i;
  uint local_28;
  bool local_1;
  
  local_28 = 0;
  __i = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)*param_2;
  while( true ) {
    uVar1._0_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_1)->flags_).match_not_bow_;
    uVar1._1_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_1)->flags_).match_not_eow_;
    uVar1._2_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_1)->flags_).match_not_null_;
    uVar1._3_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_1)->flags_).match_continuous_;
    bVar6 = false;
    if (local_28 < uVar1) {
      bVar6 = matcher_wrapper<boost::xpressive::detail::string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>>
              ::match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (in_stack_ffffffffffffffc0,
                         (match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_1);
    }
    if (bVar6 == false) break;
    local_28 = local_28 + 1;
  }
  if (((ulong)(((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)param_1)->context_).results_ptr_ & 1) != 0) {
    if ((local_28 == 0) ||
       (uVar2._0_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_1)->flags_).match_not_bow_,
       uVar2._1_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_1)->flags_).match_not_eow_,
       uVar2._2_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_1)->flags_).match_not_null_,
       uVar2._3_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_1)->flags_).match_continuous_, uVar2 <= local_28)) {
      in_stack_ffffffffffffffc8._M_current = (char *)__i;
      bVar6 = __gnu_cxx::operator==
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(ulong)in_stack_ffffffffffffffb0,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffffa8._M_current);
      __i = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffffc8._M_current;
      if (!bVar6) {
        in_stack_ffffffffffffffc8 =
             next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       (in_stack_ffffffffffffffa8);
      }
    }
    else {
      in_stack_ffffffffffffffc8._M_current = (char *)*param_2;
    }
    param_2[0x12] = in_stack_ffffffffffffffc8._M_current;
  }
  uVar3._0_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)param_1)->flags_).match_all_;
  uVar3._1_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)param_1)->flags_).match_prev_avail_;
  uVar3._2_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)param_1)->flags_).match_bol_;
  uVar3._3_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)param_1)->flags_).match_eol_;
  if (local_28 < uVar3) {
    *param_2 = __i;
    local_1 = false;
  }
  else {
    while (uVar5 = (**(code **)(*param_3 + 0x10))(param_3,param_2), (uVar5 & 1) == 0) {
      uVar4._0_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_1)->flags_).match_all_;
      uVar4._1_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_1)->flags_).match_prev_avail_;
      uVar4._2_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_1)->flags_).match_bol_;
      uVar4._3_1_ = (((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_1)->flags_).match_eol_;
      if (uVar4 == local_28) {
        *param_2 = __i;
        return false;
      }
      local_28 = local_28 - 1;
      std::advance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,int>
                (__i,(int)((ulong)in_stack_ffffffffffffffc8._M_current >> 0x20));
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }